

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O3

void HelpLong(void)

{
  undefined8 in_RAX;
  char *pcVar1;
  undefined8 extraout_RDX;
  
  puts("Usage:");
  puts(" cwebp [-preset <...>] [options] in_file [-o out_file]\n");
  puts(
      "If input size (-s) for an image is not specified, it is\nassumed to be a PNG, JPEG, TIFF or WebP file."
      );
  puts("Note: Animated PNG and WebP files are not supported.");
  puts("\nOptions:");
  puts("  -h / -help ............. short help");
  puts("  -H / -longhelp ......... long help");
  puts("  -q <float> ............. quality factor (0:small..100:big), default=75");
  puts(
      "  -alpha_q <int> ......... transparency-compression quality (0..100),\n                           default=100"
      );
  puts("  -preset <string> ....... preset setting, one of:");
  puts("                            default, photo, picture,");
  puts("                            drawing, icon, text");
  puts("     -preset must come first, as it overwrites other parameters");
  puts(
      "  -z <int> ............... activates lossless preset with given\n                           level in [0:fast, ..., 9:slowest]"
      );
  putchar(10);
  puts("  -m <int> ............... compression method (0=fast, 6=slowest), default=4");
  puts("  -segments <int> ........ number of segments to use (1..4), default=4");
  puts("  -size <int> ............ target size (in bytes)");
  puts("  -psnr <float> .......... target PSNR (in dB. typically: 42)");
  putchar(10);
  puts("  -s <int> <int> ......... input size (width x height) for YUV");
  puts("  -sns <int> ............. spatial noise shaping (0:off, 100:max), default=50");
  puts("  -f <int> ............... filter strength (0=off..100), default=60");
  puts("  -sharpness <int> ....... filter sharpness (0:most .. 7:least sharp), default=0");
  puts("  -strong ................ use strong filter instead of simple (default)");
  puts("  -nostrong .............. use simple filter instead of strong");
  puts("  -sharp_yuv ............. use sharper (and slower) RGB->YUV conversion");
  puts("  -partition_limit <int> . limit quality to fit the 512k limit on");
  puts("                           the first partition (0=no degradation ... 100=full)");
  puts("  -pass <int> ............ analysis pass number (1..10)");
  puts(
      "  -qrange <min> <max> .... specifies the permissible quality range\n                           (default: 0 100)"
      );
  puts("  -crop <x> <y> <w> <h> .. crop picture with the given rectangle");
  puts("  -resize <w> <h> ........ resize picture (*after* any cropping)");
  puts("  -mt .................... use multi-threading if available");
  puts("  -low_memory ............ reduce memory usage (slower encoding)");
  puts("  -map <int> ............. print map of extra info");
  puts("  -print_psnr ............ prints averaged PSNR distortion");
  puts("  -print_ssim ............ prints averaged SSIM distortion");
  puts("  -print_lsim ............ prints local-similarity distortion");
  puts("  -d <file.pgm> .......... dump the compressed output (PGM file)");
  puts("  -alpha_method <int> .... transparency-compression method (0..1), default=1");
  puts("  -alpha_filter <string> . predictive filtering for alpha plane,");
  puts("                           one of: none, fast (default) or best");
  puts("  -exact ................. preserve RGB values in transparent area, default=off");
  puts(
      "  -blend_alpha <hex> ..... blend colors against background color\n                           expressed as RGB values written in\n                           hexadecimal, e.g. 0xc0e0d0 for red=0xc0\n                           green=0xe0 and blue=0xd0"
      );
  puts("  -noalpha ............... discard any transparency information");
  puts("  -lossless .............. encode image losslessly, default=off");
  puts(
      "  -near_lossless <int> ... use near-lossless image preprocessing\n                           (0..100=off), default=100"
      );
  puts("  -hint <string> ......... specify image characteristics hint,");
  puts("                           one of: photo, picture or graph");
  putchar(10);
  puts("  -metadata <string> ..... comma separated list of metadata to");
  printf("                           ");
  puts("copy from the input to the output if present.");
  puts("                           Valid values: all, none (default), exif, icc, xmp");
  putchar(10);
  puts("  -short ................. condense printed message");
  puts("  -quiet ................. don\'t print anything");
  puts("  -version ............... print version number and exit");
  puts("  -noasm ................. disable all assembly optimizations");
  puts("  -v ..................... verbose, e.g. print encoding/decoding times");
  puts("  -progress .............. report encoding progress");
  putchar(10);
  puts("Experimental Options:");
  puts("  -jpeg_like ............. roughly match expected JPEG size");
  puts("  -af .................... auto-adjust filter strength");
  puts("  -pre <int> ............. pre-processing filter");
  putchar(10);
  pcVar1 = WebPGetEnabledInputFileFormats();
  printf("Supported input formats:\n  %s\n",pcVar1,extraout_RDX,in_RAX);
  return;
}

Assistant:

static void HelpLong(void) {
  printf("Usage:\n");
  printf(" cwebp [-preset <...>] [options] in_file [-o out_file]\n\n");
  printf("If input size (-s) for an image is not specified, it is\n"
         "assumed to be a PNG, JPEG, TIFF or WebP file.\n");
  printf("Note: Animated PNG and WebP files are not supported.\n");
#ifdef HAVE_WINCODEC_H
  printf("Windows builds can take as input any of the files handled by WIC.\n");
#endif
  printf("\nOptions:\n");
  printf("  -h / -help ............. short help\n");
  printf("  -H / -longhelp ......... long help\n");
  printf("  -q <float> ............. quality factor (0:small..100:big), "
         "default=75\n");
  printf("  -alpha_q <int> ......... transparency-compression quality (0..100),"
         "\n                           default=100\n");
  printf("  -preset <string> ....... preset setting, one of:\n");
  printf("                            default, photo, picture,\n");
  printf("                            drawing, icon, text\n");
  printf("     -preset must come first, as it overwrites other parameters\n");
  printf("  -z <int> ............... activates lossless preset with given\n"
         "                           level in [0:fast, ..., 9:slowest]\n");
  printf("\n");
  printf("  -m <int> ............... compression method (0=fast, 6=slowest), "
         "default=4\n");
  printf("  -segments <int> ........ number of segments to use (1..4), "
         "default=4\n");
  printf("  -size <int> ............ target size (in bytes)\n");
  printf("  -psnr <float> .......... target PSNR (in dB. typically: 42)\n");
  printf("\n");
  printf("  -s <int> <int> ......... input size (width x height) for YUV\n");
  printf("  -sns <int> ............. spatial noise shaping (0:off, 100:max), "
         "default=50\n");
  printf("  -f <int> ............... filter strength (0=off..100), "
         "default=60\n");
  printf("  -sharpness <int> ....... "
         "filter sharpness (0:most .. 7:least sharp), default=0\n");
  printf("  -strong ................ use strong filter instead "
                                     "of simple (default)\n");
  printf("  -nostrong .............. use simple filter instead of strong\n");
  printf("  -sharp_yuv ............. use sharper (and slower) RGB->YUV "
                                     "conversion\n");
  printf("  -partition_limit <int> . limit quality to fit the 512k limit on\n");
  printf("                           "
         "the first partition (0=no degradation ... 100=full)\n");
  printf("  -pass <int> ............ analysis pass number (1..10)\n");
  printf("  -qrange <min> <max> .... specifies the permissible quality range\n"
         "                           (default: 0 100)\n");
  printf("  -crop <x> <y> <w> <h> .. crop picture with the given rectangle\n");
  printf("  -resize <w> <h> ........ resize picture (*after* any cropping)\n");
  printf("  -mt .................... use multi-threading if available\n");
  printf("  -low_memory ............ reduce memory usage (slower encoding)\n");
  printf("  -map <int> ............. print map of extra info\n");
  printf("  -print_psnr ............ prints averaged PSNR distortion\n");
  printf("  -print_ssim ............ prints averaged SSIM distortion\n");
  printf("  -print_lsim ............ prints local-similarity distortion\n");
  printf("  -d <file.pgm> .......... dump the compressed output (PGM file)\n");
  printf("  -alpha_method <int> .... transparency-compression method (0..1), "
         "default=1\n");
  printf("  -alpha_filter <string> . predictive filtering for alpha plane,\n");
  printf("                           one of: none, fast (default) or best\n");
  printf("  -exact ................. preserve RGB values in transparent area, "
         "default=off\n");
  printf("  -blend_alpha <hex> ..... blend colors against background color\n"
         "                           expressed as RGB values written in\n"
         "                           hexadecimal, e.g. 0xc0e0d0 for red=0xc0\n"
         "                           green=0xe0 and blue=0xd0\n");
  printf("  -noalpha ............... discard any transparency information\n");
  printf("  -lossless .............. encode image losslessly, default=off\n");
  printf("  -near_lossless <int> ... use near-lossless image preprocessing\n"
         "                           (0..100=off), default=100\n");
  printf("  -hint <string> ......... specify image characteristics hint,\n");
  printf("                           one of: photo, picture or graph\n");

  printf("\n");
  printf("  -metadata <string> ..... comma separated list of metadata to\n");
  printf("                           ");
  printf("copy from the input to the output if present.\n");
  printf("                           "
         "Valid values: all, none (default), exif, icc, xmp\n");

  printf("\n");
  printf("  -short ................. condense printed message\n");
  printf("  -quiet ................. don't print anything\n");
  printf("  -version ............... print version number and exit\n");
#ifndef WEBP_DLL
  printf("  -noasm ................. disable all assembly optimizations\n");
#endif
  printf("  -v ..................... verbose, e.g. print encoding/decoding "
         "times\n");
  printf("  -progress .............. report encoding progress\n");
  printf("\n");
  printf("Experimental Options:\n");
  printf("  -jpeg_like ............. roughly match expected JPEG size\n");
  printf("  -af .................... auto-adjust filter strength\n");
  printf("  -pre <int> ............. pre-processing filter\n");
  printf("\n");
  printf("Supported input formats:\n  %s\n", WebPGetEnabledInputFileFormats());
}